

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *
co_await<kj::HttpServer::Connection::LoopResult>
          (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr__,
          Promise<kj::HttpServer::Connection::LoopResult> *promise)

{
  Promise<kj::HttpServer::Connection::LoopResult> *promise_00;
  PromiseNode local_20;
  Promise<kj::HttpServer::Connection::LoopResult> *promise_local;
  
  local_20.super_PromiseArenaMember.arena = (PromiseArena *)promise;
  promise_local = (Promise<kj::HttpServer::Connection::LoopResult> *)__return_storage_ptr__;
  promise_00 = kj::mv<kj::Promise<kj::HttpServer::Connection::LoopResult>>(promise);
  kj::_::PromiseNode::from<kj::Promise<kj::HttpServer::Connection::LoopResult>>
            (&local_20,promise_00);
  kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::PromiseAwaiter
            (__return_storage_ptr__,(OwnPromiseNode *)&local_20);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_20);
  return __return_storage_ptr__;
}

Assistant:

_::PromiseAwaiter<T> operator co_await(Promise<T>& promise) {
  return _::PromiseAwaiter<T>(_::PromiseNode::from(kj::mv(promise)));
}